

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regenc.c
# Opt level: O1

int onigenc_with_ascii_strncmp(OnigEncoding enc,OnigUChar *p,OnigUChar *end,OnigUChar *sascii,int n)

{
  OnigCodePoint OVar1;
  int iVar2;
  int iVar3;
  
  if (n < 1) {
    return 0;
  }
  iVar3 = n + 1;
  while( true ) {
    if (end <= p) {
      return (uint)*sascii;
    }
    OVar1 = (*enc->mbc_to_code)(p,end);
    if (*sascii - OVar1 != 0) break;
    sascii = sascii + 1;
    iVar2 = (*enc->mbc_enc_len)(p);
    p = p + iVar2;
    iVar3 = iVar3 + -1;
    if (iVar3 < 2) {
      return 0;
    }
  }
  return *sascii - OVar1;
}

Assistant:

extern int
onigenc_with_ascii_strncmp(OnigEncoding enc, const UChar* p, const UChar* end,
                           const UChar* sascii /* ascii */, int n)
{
  int x, c;

  while (n-- > 0) {
    if (p >= end) return (int )(*sascii);

    c = (int )ONIGENC_MBC_TO_CODE(enc, p, end);
    x = *sascii - c;
    if (x) return x;

    sascii++;
    p += enclen(enc, p);
  }
  return 0;
}